

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int socket_server_bind(socket_server *ss,uintptr_t opaque,int fd)

{
  undefined1 local_230 [4];
  int id;
  request_package request;
  int fd_local;
  uintptr_t opaque_local;
  socket_server *ss_local;
  
  request.dummy._252_4_ = fd;
  ss_local._4_4_ = reserve_id(ss);
  if (ss_local._4_4_ < 0) {
    ss_local._4_4_ = -1;
  }
  else {
    request.header[4] = request.dummy[0xfc];
    request.header[5] = request.dummy[0xfd];
    request.header[6] = request.dummy[0xfe];
    request.header[7] = request.dummy[0xff];
    request.header._0_4_ = ss_local._4_4_;
    request.u._0_8_ = opaque;
    send_request(ss,(request_package *)local_230,'B',0x10);
  }
  return ss_local._4_4_;
}

Assistant:

int
socket_server_bind(struct socket_server *ss, uintptr_t opaque, int fd) {
	struct request_package request;
	int id = reserve_id(ss);
	if (id < 0)
		return -1;
	request.u.bind.opaque = opaque;
	request.u.bind.id = id;
	request.u.bind.fd = fd;
	send_request(ss, &request, 'B', sizeof(request.u.bind));
	return id;
}